

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeGridTests.cpp
# Opt level: O1

void __thiscall YeeGridTest3d::SetUp(YeeGridTest3d *this)

{
  Grid<(pica::Dimension)3,_double> *this_00;
  
  (this->origin).x = -1.5;
  (this->origin).y = 3.4;
  (this->origin).z = 0.31;
  (this->step).x = 0.1;
  (this->step).y = 0.2;
  (this->step).z = 0.15;
  (this->size).x = 0xc;
  (this->size).y = 3;
  (this->size).z = 4;
  this_00 = (Grid<(pica::Dimension)3,_double> *)operator_new(0x198);
  pica::Grid<(pica::Dimension)3,_double>::Grid(this_00,&this->origin,&this->step,&this->size);
  std::auto_ptr<pica::YeeGrid<(pica::Dimension)3,_double>_>::reset
            (&this->grid,(element_type *)this_00);
  return;
}

Assistant:

virtual void SetUp()
    {
        origin = PositionType(-1.5, 3.4, 0.31);
        step = PositionType(0.1, 0.2, 0.15);
        size = IndexType(12, 3, 4);
        grid.reset(new GridType(origin, step, size));
    }